

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::map<std::string,_basic_string<char>_>,_cmCMakePresetsGraph::ReadFileResult> *
__thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Map<std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>
          (cmJSONHelper<std::map<std::string,_basic_string<char>_>,_cmCMakePresetsGraph::ReadFileResult>
           *__return_storage_ptr__,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *this,
          ReadFileResult success,ReadFileResult fail,
          function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
          *func)

{
  undefined4 in_register_0000000c;
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  local_40;
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *local_20;
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  *func_local;
  ReadFileResult fail_local;
  ReadFileResult success_local;
  
  local_20 = (function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
              *)CONCAT44(in_register_0000000c,fail);
  func_local._4_4_ = SUB84(this,0);
  func_local._0_4_ = success;
  _fail_local = __return_storage_ptr__;
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::function(&local_40,local_20);
  MapFilter<std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Map<std::__cxx11::string,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>>(cmCMakePresetsGraph::ReadFileResult,cmCMakePresetsGraph::ReadFileResult,std::function<cmCMakePresetsGraph::ReadFileResult(std::__cxx11::string&,Json::Value_const*)>)::_lambda(std::__cxx11::string_const&)_1_>
            (__return_storage_ptr__,
             (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)((ulong)this & 0xffffffff),
             success,&local_40);
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
  ::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::map<std::string, T>, E, CallState...> Map(E success,
                                                                     E fail,
                                                                     F func)
  {
    return MapFilter<T, F>(success, fail, func,
                           [](const std::string&) { return true; });
  }